

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.h
# Opt level: O3

void tcmalloc::SymbolizerAPI::With
               (FunctionRef<void_(const_tcmalloc::SymbolizerAPI_&)> body,
               FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> callback)

{
  backtrace_state *state;
  _func_void_SymbolizeOutcome_ptr_void_ptr *local_40;
  FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> callback_local;
  
  callback_local.fn = (_func_void_SymbolizeOutcome_ptr_void_ptr *)callback.data;
  local_40 = callback.fn;
  callback_local.data = &local_40;
  state = tcmalloc_backtrace_create_state((char *)0x0,0,(backtrace_error_callback)0x0,(void *)0x0);
  (*body.fn)((SymbolizerAPI *)&callback_local.data,body.data);
  tcmalloc_backtrace_dispose_state(state);
  return;
}

Assistant:

static void With(FunctionRef<void(const SymbolizerAPI& api)> body,
                   FunctionRef<void(const SymbolizeOutcome&)> callback) {
    body(SymbolizerAPI{&callback});
  }